

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O1

void __thiscall Fl_Widget_Type::write_color(Fl_Widget_Type *this,char *field,Fl_Color color)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  bVar1 = true;
  pcVar5 = (char *)0x0;
  pcVar4 = (char *)0x0;
  if ((int)color < 0x48) {
    pcVar4 = pcVar5;
    if ((int)color < 0xf) {
      if (color == 0) {
        pcVar4 = "FL_FOREGROUND_COLOR";
      }
      else if (color == 7) {
        pcVar4 = "FL_BACKGROUND2_COLOR";
      }
      else {
        if (color != 8) goto switchD_001887fd_caseD_28;
        pcVar4 = "FL_INACTIVE_COLOR";
      }
    }
    else {
      switch(color) {
      case 0x27:
        pcVar4 = "FL_DARK3";
        break;
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2e:
      case 0x30:
      case 0x33:
      case 0x35:
      case 0x37:
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x3d:
      case 0x3e:
        goto switchD_001887fd_caseD_28;
      case 0x2d:
        pcVar4 = "FL_DARK2";
        break;
      case 0x2f:
        pcVar4 = "FL_DARK1";
        break;
      case 0x31:
        pcVar4 = "FL_BACKGROUND_COLOR";
        break;
      case 0x32:
        pcVar4 = "FL_LIGHT1";
        break;
      case 0x34:
        pcVar4 = "FL_LIGHT2";
        break;
      case 0x36:
        pcVar4 = "FL_LIGHT3";
        break;
      case 0x38:
        pcVar4 = "FL_BLACK";
        break;
      case 0x3c:
        pcVar4 = "FL_DARK_GREEN";
        break;
      case 0x3f:
        pcVar4 = "FL_GREEN";
        break;
      default:
        if (color == 0xf) {
          pcVar4 = "FL_SELECTION_COLOR";
        }
        else {
          if (color != 0x20) goto switchD_001887fd_caseD_28;
          pcVar4 = "FL_GRAY0";
        }
      }
    }
  }
  else if ((int)color < 0x8c) {
    if ((int)color < 0x58) {
      if (color == 0x48) {
        pcVar4 = "FL_DARK_RED";
      }
      else {
        if (color != 0x4c) goto switchD_001887fd_caseD_28;
        pcVar4 = "FL_DARK_YELLOW";
      }
    }
    else if (color == 0x58) {
      pcVar4 = "FL_RED";
    }
    else if (color == 0x5f) {
      pcVar4 = "FL_YELLOW";
    }
    else {
      if (color != 0x88) goto switchD_001887fd_caseD_28;
      pcVar4 = "FL_DARK_BLUE";
    }
  }
  else if ((int)color < 0xdf) {
    if (color == 0x8c) {
      pcVar4 = "FL_DARK_CYAN";
    }
    else if (color == 0x98) {
      pcVar4 = "FL_DARK_MAGENTA";
    }
    else {
      if (color != 0xd8) goto switchD_001887fd_caseD_28;
      pcVar4 = "FL_BLUE";
    }
  }
  else if (color == 0xdf) {
    pcVar4 = "FL_CYAN";
  }
  else if (color == 0xf8) {
    pcVar4 = "FL_MAGENTA";
  }
  else {
    if (color != 0xff) goto switchD_001887fd_caseD_28;
    pcVar4 = "FL_WHITE";
  }
  bVar1 = false;
switchD_001887fd_caseD_28:
  iVar2 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x26])(this);
  pcVar5 = (this->super_Fl_Type).name_;
  pcVar3 = "o";
  if (pcVar5 != (char *)0x0) {
    pcVar3 = pcVar5;
  }
  pcVar5 = "this";
  if (iVar2 == 0) {
    pcVar5 = pcVar3;
  }
  pcVar3 = indent();
  if (!bVar1) {
    write_c("%s%s->%s(%s);\n",pcVar3,pcVar5,field,pcVar4);
    return;
  }
  write_c("%s%s->%s((Fl_Color)%d);\n",pcVar3,pcVar5,field,(ulong)color);
  return;
}

Assistant:

void Fl_Widget_Type::write_color(const char* field, Fl_Color color) {
  const char* color_name = 0;
  switch (color) {
  case FL_FOREGROUND_COLOR:	color_name = "FL_FOREGROUND_COLOR";	break;
  case FL_BACKGROUND2_COLOR:	color_name = "FL_BACKGROUND2_COLOR";	break;
  case FL_INACTIVE_COLOR:	color_name = "FL_INACTIVE_COLOR";	break;
  case FL_SELECTION_COLOR:	color_name = "FL_SELECTION_COLOR";	break;
  case FL_GRAY0:		color_name = "FL_GRAY0";		break;
  case FL_DARK3:		color_name = "FL_DARK3";		break;
  case FL_DARK2:		color_name = "FL_DARK2";		break;
  case FL_DARK1:		color_name = "FL_DARK1";		break;
  case FL_BACKGROUND_COLOR:	color_name = "FL_BACKGROUND_COLOR";	break;
  case FL_LIGHT1:		color_name = "FL_LIGHT1";		break;
  case FL_LIGHT2:		color_name = "FL_LIGHT2";		break;
  case FL_LIGHT3:		color_name = "FL_LIGHT3";		break;
  case FL_BLACK:		color_name = "FL_BLACK";		break;
  case FL_RED:			color_name = "FL_RED";			break;
  case FL_GREEN:		color_name = "FL_GREEN";		break;
  case FL_YELLOW:		color_name = "FL_YELLOW";		break;
  case FL_BLUE:			color_name = "FL_BLUE";			break;
  case FL_MAGENTA:		color_name = "FL_MAGENTA";		break;
  case FL_CYAN:			color_name = "FL_CYAN";			break;
  case FL_DARK_RED:		color_name = "FL_DARK_RED";		break;
  case FL_DARK_GREEN:		color_name = "FL_DARK_GREEN";		break;
  case FL_DARK_YELLOW:		color_name = "FL_DARK_YELLOW";		break;
  case FL_DARK_BLUE:		color_name = "FL_DARK_BLUE";		break;
  case FL_DARK_MAGENTA:		color_name = "FL_DARK_MAGENTA";		break;
  case FL_DARK_CYAN:		color_name = "FL_DARK_CYAN";		break;
  case FL_WHITE:		color_name = "FL_WHITE";		break;
  }
  const char *var = is_class() ? "this" : name() ? name() : "o";
  if (color_name) {
    write_c("%s%s->%s(%s);\n", indent(), var, field, color_name);
  } else {
    write_c("%s%s->%s((Fl_Color)%d);\n", indent(), var, field, color);
  }
}